

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

double __thiscall despot::BaseRockSample::Reward(BaseRockSample *this,int s,ACT_TYPE a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  bool valuable;
  undefined8 uStack_30;
  int rock;
  Coord rob_pos_1;
  Coord rob_pos;
  ACT_TYPE a_local;
  int s_local;
  BaseRockSample *this_local;
  
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  if (s == iVar2 + -1) {
    this_local = (BaseRockSample *)0x0;
  }
  else if (a < 4) {
    _rob_pos_1 = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
    despot::operator+=(&rob_pos_1,(Coord *)(&Compass::DIRECTIONS + a));
    bVar1 = Grid<int>::Inside(&this->grid_,&rob_pos_1);
    if (bVar1) {
      this_local = (BaseRockSample *)0x0;
    }
    else {
      iVar2 = _rob_pos_1;
      iVar3 = Grid<int>::xsize(&this->grid_);
      iVar4 = -100;
      if (iVar2 == iVar3) {
        iVar4 = 10;
      }
      this_local = (BaseRockSample *)(double)iVar4;
    }
  }
  else if (a == 4) {
    uStack_30 = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
    piVar5 = Grid<int>::operator()(&this->grid_,(Coord *)&stack0xffffffffffffffd0);
    if (*piVar5 < 0) {
      this_local = (BaseRockSample *)0xc059000000000000;
    }
    else {
      bVar1 = CheckFlag(s,*piVar5);
      if (bVar1) {
        this_local = (BaseRockSample *)0x4024000000000000;
      }
      else {
        this_local = (BaseRockSample *)0xc024000000000000;
      }
    }
  }
  else {
    this_local = (BaseRockSample *)0x0;
  }
  return (double)this_local;
}

Assistant:

double BaseRockSample::Reward(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return 0;

	if (a < E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			return 0;
		} else
			return rob_pos.x == grid_.xsize() ? 10 : -100;
	} else if (a == E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0) {
			bool valuable = CheckFlag(s, rock);
			if (valuable)
				return 10;
			else
				return -10;
		}
		return -100;
	} else
		return 0;
}